

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p,int *curLineNumPtr)

{
  byte bVar1;
  MemPool *pMVar2;
  bool bVar3;
  int iVar4;
  byte *p_00;
  XMLAttribute *this_00;
  char *p_01;
  char *pcVar5;
  XMLAttribute *pXVar6;
  undefined4 extraout_var;
  uint uVar7;
  XMLDocument *pXVar8;
  XMLAttribute *local_38;
  
  local_38 = (XMLAttribute *)0x0;
  p_01 = p;
  do {
    if (p_01 == (char *)0x0) {
      return (char *)0x0;
    }
    p_00 = (byte *)XMLUtil::SkipWhiteSpace(p_01,curLineNumPtr);
    bVar1 = *p_00;
    if (bVar1 == 0) {
      pXVar8 = (this->super_XMLNode)._document;
      iVar4 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
      if (CONCAT44(extraout_var,iVar4) == 0) {
        p_00 = (byte *)StrPair::GetStr(&(this->super_XMLNode)._value);
      }
      else {
        p_00 = (byte *)0x0;
      }
      iVar4 = (this->super_XMLNode)._parseLineNum;
      goto LAB_001081a9;
    }
    if (-1 < (char)bVar1) {
      uVar7 = (uint)bVar1;
      iVar4 = isalpha(uVar7);
      if (iVar4 == 0) {
        if (uVar7 < 0x3e) {
          if (uVar7 != 0x3a) {
            if ((uVar7 == 0x2f) && (p_00[1] == 0x3e)) {
              this->_closingType = CLOSED;
              return (char *)(p_00 + 2);
            }
LAB_001081ea:
            pXVar8 = (this->super_XMLNode)._document;
            iVar4 = (this->super_XMLNode)._parseLineNum;
LAB_001081a9:
            XMLDocument::SetError(pXVar8,XML_ERROR_PARSING_ELEMENT,p,(char *)p_00,iVar4);
            return (char *)0x0;
          }
        }
        else if (uVar7 != 0x5f) {
          if (uVar7 == 0x3e) {
            return (char *)(p_00 + 1);
          }
          goto LAB_001081ea;
        }
      }
    }
    this_00 = (XMLAttribute *)
              MemPoolT<80>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
    this_00->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00115980;
    (this_00->_name)._flags = 0;
    (this_00->_name)._start = (char *)0x0;
    (this_00->_name)._end = (char *)0x0;
    (this_00->_value)._flags = 0;
    (this_00->_value)._start = (char *)0x0;
    (this_00->_value)._end = (char *)0x0;
    this_00->_parseLineNum = 0;
    this_00->_next = (XMLAttribute *)0x0;
    this_00->_memPool = (MemPool *)0x0;
    pXVar8 = (this->super_XMLNode)._document;
    this_00->_memPool = &(pXVar8->_attributePool).super_MemPool;
    (*(pXVar8->_attributePool).super_MemPool._vptr_MemPool[5])();
    pXVar8 = (this->super_XMLNode)._document;
    iVar4 = pXVar8->_parseCurLineNum;
    this_00->_parseLineNum = iVar4;
    p_01 = XMLAttribute::ParseDeep(this_00,(char *)p_00,pXVar8->_processEntities,curLineNumPtr);
    if (p_01 == (char *)0x0) {
LAB_00108111:
      pMVar2 = this_00->_memPool;
      (**this_00->_vptr_XMLAttribute)(this_00);
      (*pMVar2->_vptr_MemPool[4])(pMVar2,this_00);
      XMLDocument::SetError
                ((this->super_XMLNode)._document,XML_ERROR_PARSING_ATTRIBUTE,p,p_01,iVar4);
      bVar3 = false;
    }
    else {
      pcVar5 = StrPair::GetStr(&this_00->_name);
      pXVar6 = FindAttribute(this,pcVar5);
      if ((pXVar6 != (XMLAttribute *)0x0) &&
         (pcVar5 = StrPair::GetStr(&pXVar6->_value), pcVar5 != (char *)0x0)) goto LAB_00108111;
      if (local_38 == (XMLAttribute *)0x0) {
        this->_rootAttribute = this_00;
      }
      else {
        local_38->_next = this_00;
      }
      bVar3 = true;
      local_38 = this_00;
    }
    if (!bVar3) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

char* XMLElement::ParseAttributes( char* p, int* curLineNumPtr )
{
    const char* start = p;
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, Name(), _parseLineNum );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            XMLAttribute* attrib = CreateAttribute();
            TIXMLASSERT( attrib );
            attrib->_parseLineNum = _document->_parseCurLineNum;

            int attrLineNum = attrib->_parseLineNum;

            p = attrib->ParseDeep( p, _document->ProcessEntities(), curLineNumPtr );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, start, p, attrLineNum );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                TIXMLASSERT( prevAttribute->_next == 0 );
                prevAttribute->_next = attrib;
            }
            else {
                TIXMLASSERT( _rootAttribute == 0 );
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, p, _parseLineNum );
            return 0;
        }
    }
    return p;
}